

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::ChompSetGroupInst<(UnifiedRegex::ChompMode)0>::Exec
          (ChompSetGroupInst<(UnifiedRegex::ChompMode)0> *this,Matcher *matcher,Char *input,
          CharCount inputLength,CharCount *matchStart,CharCount *inputOffset,
          CharCount *nextSyncInputOffset,uint8 **instPointer,ContStack *contStack,
          AssertionStack *assertionStack,uint *qcTicks,bool firstIteration)

{
  uint uVar1;
  int iVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  GroupInfo *pGVar6;
  undefined4 *puVar7;
  char *pcVar8;
  Type pRVar9;
  
  pGVar6 = Matcher::GroupIdToGroupInfo(matcher,(this->super_GroupMixin).groupId);
  if (pGVar6->length != 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0xf80,"(matcher.GroupIdToGroupInfo(groupId)->IsUndefined())",
                       "matcher.GroupIdToGroupInfo(groupId)->IsUndefined()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  uVar1 = *inputOffset;
  pRVar9 = matcher->stats;
  if (pRVar9 != (Type)0x0) {
    pRVar9->numCompares = pRVar9->numCompares + 1;
  }
  uVar5 = uVar1;
  while( true ) {
    if (pRVar9 != (Type)0x0) {
      pRVar9->numCompares = pRVar9->numCompares + 1;
    }
    if (inputLength <= uVar5) break;
    bVar4 = RuntimeCharSet<char16_t>::Get(&(this->super_SetMixin<false>).set,input[uVar5]);
    if (!bVar4) break;
    uVar5 = *inputOffset + 1;
    *inputOffset = uVar5;
    pRVar9 = matcher->stats;
  }
  if ((this->super_NoNeedToSaveMixin).noNeedToSave == false) {
    pcVar8 = ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
             Push<UnifiedRegex::ResetGroupCont>
                       (&contStack->
                         super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    iVar2 = (this->super_GroupMixin).groupId;
    pcVar8[8] = '\x03';
    *(undefined ***)pcVar8 = &PTR_Print_013e0248;
    *(int *)(pcVar8 + 0xc) = iVar2;
    Matcher::PushStats(matcher,contStack,input);
  }
  pGVar6 = Matcher::GroupIdToGroupInfo(matcher,(this->super_GroupMixin).groupId);
  pGVar6->offset = uVar1;
  pGVar6->length = *inputOffset - uVar1;
  *instPointer = *instPointer + 0x2e;
  return false;
}

Assistant:

inline bool ChompSetGroupInst<Mode>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        Assert(matcher.GroupIdToGroupInfo(groupId)->IsUndefined());

        const CharCount inputStartOffset = inputOffset;
        const RuntimeCharSet<Char>& matchSet = this->set;
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if (Mode == ChompMode::Star || (inputOffset < inputLength && matchSet.Get(input[inputOffset])))
        {
            while (true)
            {
                if (Mode != ChompMode::Star)
                {
                    ++inputOffset;
                }
#if ENABLE_REGEX_CONFIG_OPTIONS
                matcher.CompStats();
#endif
                if (inputOffset < inputLength && matchSet.Get(input[inputOffset]))
                {
                    if (Mode == ChompMode::Star)
                    {
                        ++inputOffset;
                    }
                    continue;
                }
                break;
            }

            if (!noNeedToSave)
            {
                // UNDO ACTION: Restore group on backtrack
                PUSH(contStack, ResetGroupCont, groupId);
#if ENABLE_REGEX_CONFIG_OPTIONS
                matcher.PushStats(contStack, input);
#endif
            }

            GroupInfo *const groupInfo = matcher.GroupIdToGroupInfo(groupId);
            groupInfo->offset = inputStartOffset;
            groupInfo->length = inputOffset - inputStartOffset;

            instPointer += sizeof(*this);
            return false;
        }

        return matcher.Fail(FAIL_PARAMETERS);
    }